

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmi_info.cpp
# Opt level: O2

void __thiscall license::os::DmiInfo::DmiInfo(DmiInfo *this)

{
  string *this_00;
  string *this_01;
  char cVar1;
  size_type sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *max_size;
  string local_90;
  string local_70;
  string local_50;
  
  this->_vptr_DmiInfo = (_func_int **)&PTR__DmiInfo_0056b8b0;
  (this->m_sys_vendor)._M_dataplus._M_p = (pointer)&(this->m_sys_vendor).field_2;
  (this->m_sys_vendor)._M_string_length = 0;
  (this->m_sys_vendor).field_2._M_local_buf[0] = '\0';
  (this->m_bios_vendor)._M_dataplus._M_p = (pointer)&(this->m_bios_vendor).field_2;
  (this->m_bios_vendor)._M_string_length = 0;
  this_00 = &this->m_sys_vendor;
  (this->m_bios_vendor).field_2._M_local_buf[0] = '\0';
  (this->m_bios_description)._M_dataplus._M_p = (pointer)&(this->m_bios_description).field_2;
  (this->m_bios_description)._M_string_length = 0;
  this_01 = &this->m_bios_description;
  (this->m_bios_description).field_2._M_local_buf[0] = '\0';
  max_size = &(this->m_cpu_manufacturer).field_2;
  (this->m_cpu_manufacturer)._M_dataplus._M_p = (pointer)max_size;
  (this->m_cpu_manufacturer)._M_string_length = 0;
  (this->m_cpu_manufacturer).field_2._M_local_buf[0] = '\0';
  this->m_cpu_cores = 0;
  get_file_contents_abi_cxx11_
            (&local_90,(license *)"/sys/class/dmi/id/sys_vendor",(char *)0x100,(size_t)max_size);
  trim_copy(&local_70,&local_90);
  toupper_copy(&local_50,&local_70);
  std::__cxx11::string::operator=((string *)&this->m_bios_vendor,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  get_file_contents_abi_cxx11_
            (&local_90,(license *)"/sys/class/dmi/id/modalias",(char *)0x100,(size_t)max_size);
  trim_copy(&local_70,&local_90);
  toupper_copy(&local_50,&local_70);
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  sVar2 = (this->m_bios_description)._M_string_length;
  cVar1 = (this->m_bios_description)._M_dataplus._M_p[sVar2 - 1];
  if ((cVar1 == '\r') || (cVar1 == '\n')) {
    std::__cxx11::string::erase((ulong)this_01,sVar2 - 1);
    std::__cxx11::string::_M_assign((string *)this_01);
  }
  get_file_contents_abi_cxx11_
            (&local_50,(license *)"/sys/class/dmi/id/sys_vendor",(char *)0x100,(size_t)max_size);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  sVar2 = (this->m_sys_vendor)._M_string_length;
  cVar1 = (this->m_sys_vendor)._M_dataplus._M_p[sVar2 - 2];
  if ((cVar1 == '\r') || (cVar1 == '\n')) {
    std::__cxx11::string::erase((ulong)this_00,sVar2 - 1);
    std::__cxx11::string::_M_assign((string *)this_00);
  }
  return;
}

Assistant:

DmiInfo::DmiInfo() {
	try {
		m_bios_vendor = toupper_copy(trim_copy(get_file_contents("/sys/class/dmi/id/sys_vendor", 256)));
	} catch (const std::exception& e) {
		m_bios_vendor = "";
		LOG_DEBUG("Can not read sys_vendor %s", e.what());
	}
	try {
		m_bios_description = toupper_copy(trim_copy(get_file_contents("/sys/class/dmi/id/modalias", 256)));
		char last_char = m_bios_description[m_bios_description.length() - 1];
		if (last_char == '\r' || last_char == '\n') {
			m_bios_description = m_bios_description.erase(m_bios_description.length() - 1);
		}
	} catch (const std::exception& e) {
		m_bios_description = "";
		LOG_DEBUG("Can not read bios_description %s", e.what());
	}
	try {
		m_sys_vendor = get_file_contents("/sys/class/dmi/id/sys_vendor", 256);
		char last_char = m_sys_vendor[m_sys_vendor.length() - 2];
		if (last_char == '\r' || last_char == '\n') {
			m_sys_vendor = m_sys_vendor.erase(m_sys_vendor.length() - 1);
		}
	} catch (const std::exception& e) {
		m_sys_vendor = "";
		LOG_DEBUG("Can not read bios_description %s", e.what());
	}
}